

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O2

void __thiscall
KDReports::ReportBuilder::setTabPositions(ReportBuilder *this,QList<QTextOption::Tab> *tabs)

{
  QList<QTextOption::Tab> *this_00;
  iterator iVar1;
  iterator iVar2;
  Tab *tab;
  qreal qVar3;
  
  this_00 = &this->m_tabPositions;
  QArrayDataPointer<QTextOption::Tab>::operator=(&this_00->d,&tabs->d);
  iVar1 = QList<QTextOption::Tab>::begin(this_00);
  iVar2 = QList<QTextOption::Tab>::end(this_00);
  for (; iVar1.i != iVar2.i; iVar1.i = iVar1.i + 1) {
    qVar3 = mmToPixels((iVar1.i)->position);
    (iVar1.i)->position = qVar3;
  }
  TextDocumentData::setUsesTabPositions(this->m_contentDocument,true);
  return;
}

Assistant:

void KDReports::ReportBuilder::setTabPositions(const QList<QTextOption::Tab> &tabs)
{
    m_tabPositions = tabs;
    for (QTextOption::Tab &tab : m_tabPositions) {
        tab.position = mmToPixels(tab.position);
    }
    m_contentDocument.setUsesTabPositions(true);
}